

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_0::WriteBufferToSink
          (anon_unknown_0 *this,char sign_char,string_view str,FormatConversionSpecImpl *conv,
          FormatSinkImpl *sink)

{
  byte bVar1;
  char c;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  undefined7 in_register_00000031;
  size_t sVar5;
  size_t n;
  string_view v;
  
  v._M_len = CONCAT71(in_register_00000031,sign_char);
  v._M_str = (char *)str._M_len;
  c = (char)this;
  uVar2 = (ulong)*(int *)(str._M_str + 4);
  if ((long)uVar2 < 0) {
    n = 0;
  }
  else {
    uVar4 = (v._M_len + 1) - (ulong)(c == '\0');
    n = 0;
    if (uVar4 <= uVar2) {
      n = uVar2 - uVar4;
    }
  }
  bVar1 = str._M_str[1];
  sVar3 = 0;
  if ((bVar1 & 0x11) == 0) {
    sVar3 = n;
  }
  FormatSinkImpl::Append((FormatSinkImpl *)conv,sVar3,' ');
  if (c != '\0') {
    FormatSinkImpl::Append((FormatSinkImpl *)conv,1,c);
  }
  sVar3 = 0;
  sVar5 = n;
  if ((bVar1 & 0x10) == 0) {
    sVar5 = sVar3;
  }
  if ((bVar1 & 1) == 0) {
    n = sVar3;
    sVar3 = sVar5;
  }
  FormatSinkImpl::Append((FormatSinkImpl *)conv,sVar3,'0');
  FormatSinkImpl::Append((FormatSinkImpl *)conv,v);
  FormatSinkImpl::Append((FormatSinkImpl *)conv,n,' ');
  return;
}

Assistant:

void WriteBufferToSink(char sign_char, absl::string_view str,
                       const FormatConversionSpecImpl &conv,
                       FormatSinkImpl *sink) {
  size_t left_spaces = 0, zeros = 0, right_spaces = 0;
  size_t missing_chars = 0;
  if (conv.width() >= 0) {
    const size_t conv_width_size_t = static_cast<size_t>(conv.width());
    const size_t existing_chars =
        str.size() + static_cast<size_t>(sign_char != 0);
    if (conv_width_size_t > existing_chars)
      missing_chars = conv_width_size_t - existing_chars;
  }
  if (conv.has_left_flag()) {
    right_spaces = missing_chars;
  } else if (conv.has_zero_flag()) {
    zeros = missing_chars;
  } else {
    left_spaces = missing_chars;
  }

  sink->Append(left_spaces, ' ');
  if (sign_char != '\0') sink->Append(1, sign_char);
  sink->Append(zeros, '0');
  sink->Append(str);
  sink->Append(right_spaces, ' ');
}